

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O0

void Vec_PtrFreeData(Vec_Ptr_t *p)

{
  int iVar1;
  void *__ptr;
  int local_1c;
  int i;
  void *pTemp;
  Vec_Ptr_t *p_local;
  
  if (p != (Vec_Ptr_t *)0x0) {
    for (local_1c = 0; iVar1 = Vec_PtrSize(p), local_1c < iVar1; local_1c = local_1c + 1) {
      __ptr = Vec_PtrEntry(p,local_1c);
      if (((__ptr != (void *)0x1) && (__ptr != (void *)0x2)) && (__ptr != (void *)0x0)) {
        free(__ptr);
      }
    }
  }
  return;
}

Assistant:

static inline void Vec_PtrFreeData( Vec_Ptr_t * p )
{
    void * pTemp; int i;
    if ( p == NULL ) return;
    Vec_PtrForEachEntry( void *, p, pTemp, i )
        if ( pTemp != (void *)(ABC_PTRINT_T)1 && pTemp != (void *)(ABC_PTRINT_T)2 )
            ABC_FREE( pTemp );
}